

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O1

void __thiscall lightconf::scanner::expect(scanner *this,char c,bool optional)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer ptVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer pcVar7;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar14;
  long *plVar15;
  undefined8 *puVar16;
  runtime_error *this_00;
  uint uVar17;
  long *plVar18;
  ulong *puVar19;
  token *extraout_RDX;
  token *tok_00;
  ulong uVar20;
  undefined8 uVar21;
  bool bVar22;
  bool bVar23;
  token tok;
  token tok_2;
  token tok_1;
  token_type local_190 [2];
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [16];
  double local_168;
  uint uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  ulong *local_150;
  token *local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  token_type local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  uint uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 local_94;
  token_type local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  double local_68;
  uint uStack_60;
  int iStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar17 = this->cur_token_;
  ptVar6 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ptVar6 >> 6;
  do {
    uVar20 = (ulong)uVar17;
    if (uVar14 <= uVar20) break;
    uVar17 = uVar17 + 1;
  } while (ptVar6[uVar20].type - whitespace_token < 2);
  local_188 = local_178;
  if (uVar14 == uVar20) {
    local_190[0] = eof_token;
    local_180 = 0;
    local_178[0] = 0;
    local_168 = 0.0;
    uStack_160 = uStack_160 & 0xffffff00;
    uStack_15c = 0;
    uStack_158 = 0;
    uStack_154 = 0;
  }
  else {
    local_190[0] = ptVar6[uVar20].type;
    pcVar7 = ptVar6[uVar20].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,pcVar7,pcVar7 + ptVar6[uVar20].string_value._M_string_length);
    uVar2 = ptVar6[uVar20].line;
    uVar8 = ptVar6[uVar20].col;
    local_168 = ptVar6[uVar20].number_value;
    uVar21 = (&ptVar6[uVar20].number_value)[1];
    uStack_160 = (uint)uVar21;
    uStack_15c = (undefined4)((ulong)uVar21 >> 0x20);
    uStack_158 = uVar2;
    uStack_154 = uVar8;
  }
  bVar22 = local_190[0] == char_token;
  bVar23 = (char)uStack_160 == c;
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (bVar23 && bVar22) {
    skip_whitespace(this,false);
    if ((ulong)this->cur_token_ <=
        ((long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start >> 6) - 1U) {
      this->cur_token_ = this->cur_token_ + 1;
    }
    return;
  }
  if (optional) {
    return;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11a858);
  local_f0 = (long *)*plVar15;
  plVar18 = plVar15 + 2;
  if (local_f0 == plVar18) {
    local_e0 = *plVar18;
    lStack_d8 = plVar15[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar18;
  }
  local_e8 = plVar15[1];
  *plVar15 = (long)plVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_150 = (ulong *)*plVar15;
  puVar19 = (ulong *)(plVar15 + 2);
  if (local_150 == puVar19) {
    local_140 = *puVar19;
    uStack_138 = (undefined4)plVar15[3];
    uStack_134 = *(undefined4 *)((long)plVar15 + 0x1c);
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar19;
  }
  tok_00 = (token *)plVar15[1];
  *plVar15 = (long)puVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  uVar14 = (ulong)this->cur_token_;
  ptVar6 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_148 = tok_00;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 6 == uVar14) {
    local_180 = 0;
    local_178[0] = 0;
    local_168 = 0.0;
    uStack_160 = uStack_160 & 0xffffff00;
    uStack_15c = 0;
    uStack_158 = 0;
    uStack_154 = 0;
    local_190[0] = eof_token;
    local_188 = local_178;
  }
  else {
    local_190[0] = ptVar6[uVar14].type;
    pcVar7 = ptVar6[uVar14].string_value._M_dataplus._M_p;
    local_188 = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,pcVar7,pcVar7 + ptVar6[uVar14].string_value._M_string_length);
    uVar3 = ptVar6[uVar14].line;
    uVar9 = ptVar6[uVar14].col;
    local_168 = ptVar6[uVar14].number_value;
    ptVar6 = ptVar6 + uVar14;
    uVar21._0_1_ = ptVar6->char_value;
    uVar21._1_3_ = *(undefined3 *)&ptVar6->field_0x31;
    uVar21._4_4_ = ptVar6->pos;
    uStack_160 = (uint)uVar21;
    tok_00 = extraout_RDX;
    uStack_15c = uVar21._4_4_;
    uStack_158 = uVar3;
    uStack_154 = uVar9;
  }
  token_name_abi_cxx11_(&local_110,(lightconf *)local_190,tok_00);
  uVar14 = (long)&local_148->type + local_110._M_string_length;
  uVar20 = 0xf;
  if (local_150 != &local_140) {
    uVar20 = local_140;
  }
  if (uVar20 < uVar14) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar21 = local_110.field_2._M_allocated_capacity;
    }
    if (uVar14 <= (ulong)uVar21) {
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
      goto LAB_0010e0e9;
    }
  }
  puVar16 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
LAB_0010e0e9:
  local_130 = (undefined8 *)*puVar16;
  puVar1 = puVar16 + 2;
  if (local_130 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = *(undefined4 *)(puVar16 + 3);
    uStack_114 = *(undefined4 *)((long)puVar16 + 0x1c);
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
  }
  local_128 = puVar16[1];
  *puVar16 = puVar1;
  puVar16[1] = 0;
  *(undefined1 *)puVar1 = 0;
  uVar14 = (ulong)this->cur_token_;
  ptVar6 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 6 == uVar14) {
    local_88 = local_78;
    local_80 = 0;
    local_78[0] = 0;
    local_68 = 0.0;
    uStack_60 = uStack_60 & 0xffffff00;
    iStack_5c = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_90 = eof_token;
  }
  else {
    local_90 = ptVar6[uVar14].type;
    local_88 = local_78;
    pcVar7 = ptVar6[uVar14].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar7,pcVar7 + ptVar6[uVar14].string_value._M_string_length);
    uVar4 = ptVar6[uVar14].line;
    uVar10 = ptVar6[uVar14].col;
    local_68 = ptVar6[uVar14].number_value;
    uStack_60 = *(uint *)&ptVar6[uVar14].char_value;
    iStack_5c = ptVar6[uVar14].pos;
    uStack_58 = uVar4;
    local_54 = uVar10;
  }
  uVar13 = uStack_58;
  uVar14 = (ulong)this->cur_token_;
  ptVar6 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 6 == uVar14) {
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    local_a8 = 0.0;
    uStack_a0 = uStack_a0 & 0xffffff00;
    iStack_9c = 0;
    uStack_98 = 0;
    local_94 = 0;
    local_d0 = eof_token;
  }
  else {
    local_d0 = ptVar6[uVar14].type;
    local_c8 = local_b8;
    pcVar7 = ptVar6[uVar14].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar7,pcVar7 + ptVar6[uVar14].string_value._M_string_length);
    uVar5 = ptVar6[uVar14].line;
    uVar11 = ptVar6[uVar14].col;
    local_a8 = ptVar6[uVar14].number_value;
    uStack_a0 = *(uint *)&ptVar6[uVar14].char_value;
    iStack_9c = ptVar6[uVar14].pos;
    uStack_98 = uVar5;
    local_94 = uVar11;
  }
  uVar12 = local_94;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,(string *)&local_130);
  *(undefined ***)this_00 = &PTR__runtime_error_00120cb8;
  *(undefined4 *)(this_00 + 0x10) = uVar13;
  *(undefined4 *)(this_00 + 0x14) = uVar12;
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void scanner::expect(char c, bool optional) {
    if (peek_token().is_char(c)) {
        skip_whitespace(false);
        next_token();
    } else {
        if (!optional) {
            fail("expected '" + std::string(1, c) + "' but found " + token_name(cur_token()),
                cur_token().line, cur_token().col);
        }
    }
}